

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.hxx
# Opt level: O0

const_iterator __thiscall
cmsys::
hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::begin(hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  hash_map<const_char_*,_int,_cmsys::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<char>_>
  *this_local;
  
  cVar1 = hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
          ::begin(&this->_M_ht);
  cVar2._M_cur = cVar1._M_cur;
  cVar2._M_ht = cVar1._M_ht;
  return cVar2;
}

Assistant:

const_iterator begin() const { return _M_ht.begin(); }